

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall rw::Frame::syncHierarchyLTM(Frame *this)

{
  uint8 *puVar1;
  byte hierarchyFlags;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  float32 fVar12;
  
  hierarchyFlags = (this->object).privateFlags;
  if ((hierarchyFlags & 4) != 0) {
    fVar11 = (this->matrix).right.x;
    fVar12 = (this->matrix).right.y;
    uVar2 = *(undefined8 *)&(this->matrix).right.z;
    fVar9 = (this->matrix).up.x;
    fVar10 = (this->matrix).up.y;
    uVar3 = *(undefined8 *)&(this->matrix).up.z;
    fVar7 = (this->matrix).at.x;
    fVar8 = (this->matrix).at.y;
    uVar4 = *(undefined8 *)&(this->matrix).at.z;
    fVar6 = (this->matrix).pos.y;
    uVar5 = *(undefined8 *)&(this->matrix).pos.z;
    (this->ltm).pos.x = (this->matrix).pos.x;
    (this->ltm).pos.y = fVar6;
    *(undefined8 *)&(this->ltm).pos.z = uVar5;
    (this->ltm).at.x = fVar7;
    (this->ltm).at.y = fVar8;
    *(undefined8 *)&(this->ltm).at.z = uVar4;
    (this->ltm).up.x = fVar9;
    (this->ltm).up.y = fVar10;
    *(undefined8 *)&(this->ltm).up.z = uVar3;
    (this->ltm).right.x = fVar11;
    (this->ltm).right.y = fVar12;
    *(undefined8 *)&(this->ltm).right.z = uVar2;
  }
  syncLTMRecurse(this->child,hierarchyFlags);
  puVar1 = &(this->object).privateFlags;
  *puVar1 = *puVar1 & 0xfa;
  return;
}

Assistant:

void
Frame::syncHierarchyLTM(void)
{
	// Sync root's LTM
	if(this->object.privateFlags & Frame::SUBTREESYNCLTM)
		this->ltm = this->matrix;
	// ...and children
	syncLTMRecurse(this->child, this->object.privateFlags);
	// all clean now
	this->object.privateFlags &= ~Frame::SYNCLTM;
}